

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O1

void __thiscall HEkkDual::improveChooseColumnRow(HEkkDual *this,HVector *row_ep)

{
  HEkkDualRow *this_00;
  
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x3a,0);
  this_00 = &this->dualRow;
  HEkkDualRow::deleteFreemove(this_00);
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x3a,0);
  HEkk::unitBtranIterativeRefinement(this->ekk_instance_,this->row_out,row_ep);
  HEkk::tableauRowPrice(this->ekk_instance_,true,row_ep,&this->row_ap,-2);
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x2e,0);
  HEkkDualRow::clear(this_00);
  (this->dualRow).workDelta = this->delta_primal;
  HEkkDualRow::createFreemove(this_00,row_ep);
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x2e,0);
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x30,0);
  HEkkDualRow::chooseMakepack(this_00,&this->row_ap,0);
  HEkkDualRow::chooseMakepack(this_00,row_ep,this->solver_num_col);
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x30,0);
  return;
}

Assistant:

void HEkkDual::improveChooseColumnRow(HVector* row_ep) {
  HighsLp& lp = ekk_instance_.lp_;
  const bool debug_price_report_on = false;
  HighsInt debug_price_report = kDebugReportOff;
  bool debug_rows_report = false;
  if (ekk_instance_.debug_iteration_report_) {
    if (debug_price_report_on) debug_price_report = kDebugReportAll;
    debug_rows_report = debug_price_report_on;
    if (debug_price_report != kDebugReportOff)
      printf("HEkkDual::chooseColumn Check iter = %d\n",
             (int)ekk_instance_.iteration_count_);
  }

  analysis->simplexTimerStart(Chuzc5Clock);
  dualRow.deleteFreemove();
  analysis->simplexTimerStop(Chuzc5Clock);

  if (debug_rows_report)
    ekk_instance_.simplex_nla_.reportArray("Row e_p.0", lp.num_col_, row_ep,
                                           true);
  ekk_instance_.unitBtranIterativeRefinement(row_out, *row_ep);
  if (debug_rows_report)
    ekk_instance_.simplex_nla_.reportArray("Row e_p.1", lp.num_col_, row_ep,
                                           true);

  const bool quad_precision = true;
  ekk_instance_.tableauRowPrice(quad_precision, *row_ep, row_ap,
                                debug_price_report);
  if (debug_rows_report) {
    ekk_instance_.simplex_nla_.reportArray("Row a_p", 0, &row_ap, true);
    ekk_instance_.simplex_nla_.reportArray("Row e_p", lp.num_col_, row_ep,
                                           true);
  }
  analysis->simplexTimerStart(Chuzc0Clock);
  dualRow.clear();
  dualRow.workDelta = delta_primal;
  dualRow.createFreemove(row_ep);
  analysis->simplexTimerStop(Chuzc0Clock);
  //
  // Section 1: Pack row_ap and row_ep
  analysis->simplexTimerStart(Chuzc1Clock);
  // Pack row_ap into the packIndex/Value of HEkkDualRow
  dualRow.chooseMakepack(&row_ap, 0);
  // Pack row_ep into the packIndex/Value of HEkkDualRow
  dualRow.chooseMakepack(row_ep, solver_num_col);
  analysis->simplexTimerStop(Chuzc1Clock);
}